

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O3

int Curl_getaddrinfo_ex(char *nodename,char *servname,addrinfo *hints,Curl_addrinfo **result)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Curl_addrinfo *pCVar4;
  sockaddr *__dest;
  char *pcVar5;
  Curl_addrinfo *pCVar6;
  size_t __n;
  addrinfo *paVar7;
  Curl_addrinfo *pCVar8;
  addrinfo *aihead;
  addrinfo *local_38;
  
  *result = (Curl_addrinfo *)0x0;
  iVar3 = getaddrinfo(nodename,servname,(addrinfo *)hints,&local_38);
  if (iVar3 == 0) {
    if (local_38 == (addrinfo *)0x0) {
      pCVar8 = (Curl_addrinfo *)0x0;
    }
    else {
      pCVar6 = (Curl_addrinfo *)0x0;
      pCVar8 = (Curl_addrinfo *)0x0;
      paVar7 = local_38;
      do {
        pCVar4 = pCVar6;
        if (paVar7->ai_family == 2) {
          __n = 0x10;
LAB_0013a3d5:
          if ((paVar7->ai_addr == (sockaddr *)0x0) || (paVar7->ai_addrlen < (uint)__n))
          goto LAB_0013a3e5;
          pCVar4 = (Curl_addrinfo *)(*Curl_cmalloc)(0x30);
          if (pCVar4 != (Curl_addrinfo *)0x0) {
            iVar3 = paVar7->ai_family;
            iVar1 = paVar7->ai_socktype;
            iVar2 = paVar7->ai_protocol;
            pCVar4->ai_flags = paVar7->ai_flags;
            pCVar4->ai_family = iVar3;
            pCVar4->ai_socktype = iVar1;
            pCVar4->ai_protocol = iVar2;
            pCVar4->ai_addrlen = (uint)__n;
            pCVar4->ai_canonname = (char *)0x0;
            pCVar4->ai_addr = (sockaddr *)0x0;
            pCVar4->ai_next = (Curl_addrinfo *)0x0;
            __dest = (sockaddr *)(*Curl_cmalloc)(__n);
            pCVar4->ai_addr = __dest;
            if (__dest != (sockaddr *)0x0) {
              memcpy(__dest,paVar7->ai_addr,__n);
              if (paVar7->ai_canonname != (char *)0x0) {
                pcVar5 = (*Curl_cstrdup)(paVar7->ai_canonname);
                pCVar4->ai_canonname = pcVar5;
                if (pcVar5 == (char *)0x0) {
                  (*Curl_cfree)(pCVar4->ai_addr);
                  goto LAB_0013a4b7;
                }
              }
              if (pCVar8 == (Curl_addrinfo *)0x0) {
                pCVar8 = pCVar4;
              }
              if (pCVar6 != (Curl_addrinfo *)0x0) {
                pCVar6->ai_next = pCVar4;
              }
              goto LAB_0013a3e5;
            }
LAB_0013a4b7:
            (*Curl_cfree)(pCVar4);
          }
          if (local_38 != (addrinfo *)0x0) {
            freeaddrinfo(local_38);
          }
          iVar3 = -10;
          while (pCVar8 != (Curl_addrinfo *)0x0) {
            (*Curl_cfree)(pCVar8->ai_addr);
            (*Curl_cfree)(pCVar8->ai_canonname);
            pCVar6 = pCVar8->ai_next;
            (*Curl_cfree)(pCVar8);
            pCVar8 = pCVar6;
          }
          pCVar8 = (Curl_addrinfo *)0x0;
          goto LAB_0013a50b;
        }
        if (paVar7->ai_family == 10) {
          __n = 0x1c;
          goto LAB_0013a3d5;
        }
LAB_0013a3e5:
        pCVar6 = pCVar4;
        paVar7 = paVar7->ai_next;
      } while (paVar7 != (addrinfo *)0x0);
      if (local_38 != (addrinfo *)0x0) {
        freeaddrinfo(local_38);
      }
    }
    iVar3 = (uint)(pCVar8 != (Curl_addrinfo *)0x0) * 2 + -2;
LAB_0013a50b:
    *result = pCVar8;
  }
  return iVar3;
}

Assistant:

int
Curl_getaddrinfo_ex(const char *nodename,
                    const char *servname,
                    const struct addrinfo *hints,
                    Curl_addrinfo **result)
{
  const struct addrinfo *ai;
  struct addrinfo *aihead;
  Curl_addrinfo *cafirst = NULL;
  Curl_addrinfo *calast = NULL;
  Curl_addrinfo *ca;
  size_t ss_size;
  int error;

  *result = NULL; /* assume failure */

  error = getaddrinfo(nodename, servname, hints, &aihead);
  if(error)
    return error;

  /* traverse the addrinfo list */

  for(ai = aihead; ai != NULL; ai = ai->ai_next) {

    /* ignore elements with unsupported address family, */
    /* settle family-specific sockaddr structure size.  */
    if(ai->ai_family == AF_INET)
      ss_size = sizeof(struct sockaddr_in);
#ifdef ENABLE_IPV6
    else if(ai->ai_family == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
#endif
    else
      continue;

    /* ignore elements without required address info */
    if((ai->ai_addr == NULL) || !(ai->ai_addrlen > 0))
      continue;

    /* ignore elements with bogus address size */
    if((size_t)ai->ai_addrlen < ss_size)
      continue;

    if((ca = malloc(sizeof(Curl_addrinfo))) == NULL) {
      error = EAI_MEMORY;
      break;
    }

    /* copy each structure member individually, member ordering, */
    /* size, or padding might be different for each platform.    */

    ca->ai_flags     = ai->ai_flags;
    ca->ai_family    = ai->ai_family;
    ca->ai_socktype  = ai->ai_socktype;
    ca->ai_protocol  = ai->ai_protocol;
    ca->ai_addrlen   = (curl_socklen_t)ss_size;
    ca->ai_addr      = NULL;
    ca->ai_canonname = NULL;
    ca->ai_next      = NULL;

    if((ca->ai_addr = malloc(ss_size)) == NULL) {
      error = EAI_MEMORY;
      free(ca);
      break;
    }
    memcpy(ca->ai_addr, ai->ai_addr, ss_size);

    if(ai->ai_canonname != NULL) {
      if((ca->ai_canonname = strdup(ai->ai_canonname)) == NULL) {
        error = EAI_MEMORY;
        free(ca->ai_addr);
        free(ca);
        break;
      }
    }

    /* if the return list is empty, this becomes the first element */
    if(!cafirst)
      cafirst = ca;

    /* add this element last in the return list */
    if(calast)
      calast->ai_next = ca;
    calast = ca;

  }

  /* destroy the addrinfo list */
  if(aihead)
    freeaddrinfo(aihead);

  /* if we failed, also destroy the Curl_addrinfo list */
  if(error) {
    Curl_freeaddrinfo(cafirst);
    cafirst = NULL;
  }
  else if(!cafirst) {
#ifdef EAI_NONAME
    /* rfc3493 conformant */
    error = EAI_NONAME;
#else
    /* rfc3493 obsoleted */
    error = EAI_NODATA;
#endif
#ifdef USE_WINSOCK
    SET_SOCKERRNO(error);
#endif
  }

  *result = cafirst;

  /* This is not a CURLcode */
  return error;
}